

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmNinjaTargetGenerator::LanguageDyndepRule
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang,string *config)

{
  string *name;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_f0;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  undefined1 local_b8 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_98;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  size_type local_68;
  pointer local_60;
  string *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined8 local_40;
  size_type local_38;
  pointer local_30;
  undefined8 local_28;
  
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_f0,name);
  local_98.first._M_str = (lang->_M_dataplus)._M_p;
  local_98.first._M_len = lang->_M_string_length;
  local_98.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_80 = 9;
  local_78 = "_DYNDEP__";
  local_70 = 0;
  local_68 = local_f0._M_string_length;
  local_60 = local_f0._M_dataplus._M_p;
  local_c0 = local_b8;
  local_d0 = 0;
  local_c8 = 1;
  local_b8[0] = 0x5f;
  local_50 = 1;
  local_40 = 0;
  local_30 = (config->_M_dataplus)._M_p;
  local_38 = config->_M_string_length;
  local_28 = 0;
  views._M_len = 5;
  views._M_array = &local_98;
  local_58 = &local_f0;
  local_48 = local_c0;
  cmCatViews(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::LanguageDyndepRule(
  const std::string& lang, const std::string& config) const
{
  return cmStrCat(
    lang, "_DYNDEP__",
    cmGlobalNinjaGenerator::EncodeRuleName(this->GeneratorTarget->GetName()),
    '_', config);
}